

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.cpp
# Opt level: O1

void __thiscall
deqp::gls::ShaderRenderCase::computeVertexReference
          (ShaderRenderCase *this,Surface *result,QuadGrid *quadGrid)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined8 *puVar4;
  int i_4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  int i_1;
  int iVar7;
  undefined8 *puVar8;
  int x;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colors;
  Vector<float,_4> res_1;
  Vector<float,_4> res;
  Vec4 color;
  Vec4 c00;
  Vec4 c11;
  Vec4 c10;
  Vec4 c01;
  ShaderEvalContext evalCtx;
  RGBA local_33c;
  undefined1 local_338 [16];
  ulong local_320;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_318;
  ulong local_300;
  ulong local_2f8;
  ulong local_2f0;
  float local_2e8 [20];
  Vec4 local_298;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  ShaderEvalContext local_240;
  
  iVar1 = result->m_width;
  iVar2 = result->m_height;
  uVar3 = quadGrid->m_gridSize;
  uVar9 = uVar3 + 1;
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar5 = *(int *)(CONCAT44(extraout_var,iVar5) + 0x14);
  ShaderEvalContext::ShaderEvalContext(&local_240,quadGrid);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&local_318,(long)(int)(uVar9 * uVar9),(allocator_type *)&local_288);
  if ((ulong)uVar3 < 0x7fffffff) {
    lVar12 = 0;
    uVar11 = 0;
    do {
      local_338._0_4_ = (float)(int)uVar11 / (float)(int)uVar3;
      uVar10 = 0;
      do {
        ShaderEvalContext::reset
                  (&local_240,(float)(int)uVar10 / (float)(int)uVar3,(float)local_338._0_4_);
        (*this->m_evaluator->_vptr_ShaderEvaluator[2])(this->m_evaluator,&local_240);
        fVar14 = local_240.color.m_data[3];
        if (iVar5 < 1) {
          fVar14 = 1.0;
        }
        iVar6 = (int)lVar12 + (int)uVar10;
        local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar6].m_data[2] = local_240.color.m_data[2];
        *(undefined8 *)
         local_318.
         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
         super__Vector_impl_data._M_start[iVar6].m_data = local_240.color.m_data._0_8_;
        local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar6].m_data[3] = fVar14;
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
      lVar12 = lVar12 + (ulong)uVar9;
      bVar13 = uVar11 != uVar3;
      uVar11 = uVar11 + 1;
    } while (bVar13);
  }
  if (0 < (int)uVar3) {
    fVar14 = (float)(int)uVar3;
    uVar10 = 0;
    do {
      iVar5 = (int)uVar10;
      uVar11 = iVar5 + 1;
      fVar21 = ((float)iVar5 / fVar14) * (float)iVar2;
      fVar18 = ((float)(int)uVar11 / fVar14) * (float)iVar2;
      fVar15 = ceilf(fVar21 + -0.5);
      fVar16 = ceilf(fVar18 + -0.5);
      local_2f8 = (ulong)(iVar5 * uVar9);
      local_320 = (ulong)(uVar11 * uVar9);
      local_2f0 = 0;
      local_300 = (ulong)uVar11;
      do {
        iVar6 = (int)local_2f0;
        local_2f0 = local_2f0 + 1;
        fVar22 = ((float)iVar6 / fVar14) * (float)iVar1;
        fVar19 = ((float)(int)local_2f0 / fVar14) * (float)iVar1;
        local_338._0_4_ = fVar19;
        fVar19 = ceilf(fVar19 + -0.5);
        iVar5 = (int)local_2f8;
        iVar7 = (int)local_320;
        fVar17 = ceilf(fVar22 + -0.5);
        local_288 = *(undefined8 *)
                     local_318.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar6 + iVar5].m_data;
        uStack_280 = *(undefined8 *)
                      (local_318.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar6 + iVar5].m_data + 2);
        local_258 = *(undefined8 *)
                     local_318.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar6 + iVar5 + 1].m_data;
        uStack_250 = *(undefined8 *)
                      (local_318.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar6 + iVar5 + 1].m_data + 2);
        local_268 = *(undefined8 *)
                     local_318.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar7 + iVar6].m_data;
        uStack_260 = *(undefined8 *)
                      (local_318.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar7 + iVar6].m_data + 2);
        local_278 = *(undefined8 *)
                     local_318.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(int)local_320 + iVar6 + 1].m_data;
        uStack_270 = *(undefined8 *)
                      (local_318.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(int)local_320 + iVar6 + 1].m_data
                      + 2);
        if ((int)fVar15 < (int)fVar16) {
          fVar20 = (float)local_338._0_4_ - fVar22;
          iVar5 = (int)fVar15;
          do {
            if ((int)fVar17 < (int)fVar19) {
              fVar23 = (((float)iVar5 + 0.5) - fVar21) * (1.0 / (fVar18 - fVar21));
              fVar24 = 1.0;
              if (fVar23 <= 1.0) {
                fVar24 = fVar23;
              }
              fVar24 = (float)(-(uint)(0.0 < fVar23) & (uint)fVar24);
              local_338 = ZEXT416((uint)(1.0 - fVar24));
              iVar6 = (int)fVar17;
              do {
                fVar25 = (((float)iVar6 + 0.5) - fVar22) * (1.0 / fVar20);
                fVar23 = 1.0;
                if (fVar25 <= 1.0) {
                  fVar23 = fVar25;
                }
                fVar23 = (float)(-(uint)(0.0 < fVar25) & (uint)fVar23);
                fVar25 = fVar23 + fVar24;
                puVar8 = &local_268;
                puVar4 = &local_278;
                if (fVar25 <= 1.0) {
                  puVar8 = &local_258;
                  puVar4 = &local_288;
                }
                local_2e8[8] = 0.0;
                local_2e8[9] = 0.0;
                local_2e8[10] = 0.0;
                local_2e8[0xb] = 0.0;
                lVar12 = 0;
                do {
                  local_2e8[lVar12 + 8] =
                       *(float *)((long)puVar8 + lVar12 * 4) - *(float *)((long)puVar4 + lVar12 * 4)
                  ;
                  lVar12 = lVar12 + 1;
                } while (lVar12 != 4);
                if (1.0 < fVar25) {
                  fVar23 = 1.0 - fVar23;
                }
                local_2e8[0xc] = 0.0;
                local_2e8[0xd] = 0.0;
                local_2e8[0xe] = 0.0;
                local_2e8[0xf] = 0.0;
                lVar12 = 0;
                do {
                  local_2e8[lVar12 + 0xc] = local_2e8[lVar12 + 8] * fVar23;
                  lVar12 = lVar12 + 1;
                } while (lVar12 != 4);
                local_2e8[0x10] = 0.0;
                local_2e8[0x11] = 0.0;
                local_2e8[0x12] = 0.0;
                local_2e8[0x13] = 0.0;
                lVar12 = 0;
                do {
                  local_2e8[lVar12 + 0x10] =
                       *(float *)((long)puVar4 + lVar12 * 4) + local_2e8[lVar12 + 0xc];
                  lVar12 = lVar12 + 1;
                } while (lVar12 != 4);
                puVar8 = &local_258;
                if (fVar25 <= 1.0) {
                  puVar8 = &local_268;
                }
                local_2e8[0] = 0.0;
                local_2e8[1] = 0.0;
                local_2e8[2] = 0.0;
                local_2e8[3] = 0.0;
                lVar12 = 0;
                do {
                  local_2e8[lVar12] =
                       *(float *)((long)puVar8 + lVar12 * 4) - *(float *)((long)puVar4 + lVar12 * 4)
                  ;
                  lVar12 = lVar12 + 1;
                } while (lVar12 != 4);
                local_2e8[4] = 0.0;
                local_2e8[5] = 0.0;
                local_2e8[6] = 0.0;
                local_2e8[7] = 0.0;
                lVar12 = 0;
                do {
                  local_2e8[lVar12 + 4] =
                       local_2e8[lVar12] *
                       (float)(~-(uint)(fVar25 <= 1.0) & local_338._0_4_ |
                              -(uint)(fVar25 <= 1.0) & (uint)fVar24);
                  lVar12 = lVar12 + 1;
                } while (lVar12 != 4);
                local_298.m_data[0] = 0.0;
                local_298.m_data[1] = 0.0;
                local_298.m_data[2] = 0.0;
                local_298.m_data[3] = 0.0;
                lVar12 = 0;
                do {
                  local_298.m_data[lVar12] = local_2e8[lVar12 + 0x10] + local_2e8[lVar12 + 4];
                  lVar12 = lVar12 + 1;
                } while (lVar12 != 4);
                tcu::RGBA::RGBA(&local_33c,&local_298);
                *(deUint32 *)
                 ((long)(result->m_pixels).m_ptr + (long)(result->m_width * iVar5 + iVar6) * 4) =
                     local_33c.m_value;
                iVar6 = iVar6 + 1;
              } while (iVar6 != (int)fVar19);
            }
            iVar5 = iVar5 + 1;
          } while (iVar5 != (int)fVar16);
        }
      } while (local_2f0 != uVar3);
      uVar10 = local_300;
    } while ((uint)local_300 != uVar3);
  }
  if (local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_318.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_318.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_318.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ShaderRenderCase::computeVertexReference (Surface& result, const QuadGrid& quadGrid)
{
	// Buffer info.
	int					width		= result.getWidth();
	int					height		= result.getHeight();
	int					gridSize	= quadGrid.getGridSize();
	int					stride		= gridSize + 1;
	bool				hasAlpha	= m_renderCtx.getRenderTarget().getPixelFormat().alphaBits > 0;
	ShaderEvalContext	evalCtx		(quadGrid);

	// Evaluate color for each vertex.
	vector<Vec4> colors((gridSize+1)*(gridSize+1));
	for (int y = 0; y < gridSize+1; y++)
	for (int x = 0; x < gridSize+1; x++)
	{
		float				sx			= (float)x / (float)gridSize;
		float				sy			= (float)y / (float)gridSize;
		int					vtxNdx		= ((y * (gridSize+1)) + x);

		evalCtx.reset(sx, sy);
		m_evaluator.evaluate(evalCtx);
		DE_ASSERT(!evalCtx.isDiscarded); // Discard is not available in vertex shader.
		Vec4 color = evalCtx.color;

		if (!hasAlpha)
			color.w() = 1.0f;

		colors[vtxNdx] = color;
	}

	// Render quads.
	for (int y = 0; y < gridSize; y++)
	for (int x = 0; x < gridSize; x++)
	{
		float x0 = (float)x       / (float)gridSize;
		float x1 = (float)(x + 1) / (float)gridSize;
		float y0 = (float)y       / (float)gridSize;
		float y1 = (float)(y + 1) / (float)gridSize;

		float sx0 = x0 * (float)width;
		float sx1 = x1 * (float)width;
		float sy0 = y0 * (float)height;
		float sy1 = y1 * (float)height;
		float oosx = 1.0f / (sx1 - sx0);
		float oosy = 1.0f / (sy1 - sy0);

		int ix0 = deCeilFloatToInt32(sx0 - 0.5f);
		int ix1 = deCeilFloatToInt32(sx1 - 0.5f);
		int iy0 = deCeilFloatToInt32(sy0 - 0.5f);
		int iy1 = deCeilFloatToInt32(sy1 - 0.5f);

		int		v00 = (y * stride) + x;
		int		v01 = (y * stride) + x + 1;
		int		v10 = ((y + 1) * stride) + x;
		int		v11 = ((y + 1) * stride) + x + 1;
		Vec4	c00 = colors[v00];
		Vec4	c01 = colors[v01];
		Vec4	c10 = colors[v10];
		Vec4	c11 = colors[v11];

		//printf("(%d,%d) -> (%f..%f, %f..%f) (%d..%d, %d..%d)\n", x, y, sx0, sx1, sy0, sy1, ix0, ix1, iy0, iy1);

		for (int iy = iy0; iy < iy1; iy++)
		for (int ix = ix0; ix < ix1; ix++)
		{
			DE_ASSERT(deInBounds32(ix, 0, width));
			DE_ASSERT(deInBounds32(iy, 0, height));

			float		sfx		= (float)ix + 0.5f;
			float		sfy		= (float)iy + 0.5f;
			float		fx1		= deFloatClamp((sfx - sx0) * oosx, 0.0f, 1.0f);
			float		fy1		= deFloatClamp((sfy - sy0) * oosy, 0.0f, 1.0f);

			// Triangle quad interpolation.
			bool		tri		= fx1 + fy1 <= 1.0f;
			float		tx		= tri ? fx1 : (1.0f-fx1);
			float		ty		= tri ? fy1 : (1.0f-fy1);
			const Vec4&	t0		= tri ? c00 : c11;
			const Vec4&	t1		= tri ? c01 : c10;
			const Vec4&	t2		= tri ? c10 : c01;
			Vec4		color	= t0 + (t1-t0)*tx + (t2-t0)*ty;

			result.setPixel(ix, iy, tcu::RGBA(color));
		}
	}
}